

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O0

void anon_unknown.dwarf_2117df::set_cb
               (Caliper *c,ChannelBody *param_2,Attribute *attr,Variant *value)

{
  ostream *poVar1;
  string local_268;
  Log local_238;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> lock;
  Variant *value_local;
  Attribute *attr_local;
  ChannelBody *param_1_local;
  Caliper *c_local;
  
  lock._M_device = (mutex_type *)value;
  std::lock_guard<std::mutex>::lock_guard(&local_30,(mutex_type *)(anonymous_namespace)::dbg_mutex);
  cali::Log::Log(&local_238,1);
  poVar1 = cali::Log::stream(&local_238);
  poVar1 = std::operator<<(poVar1,"Event: pre_set (");
  cali::Attribute::name_abi_cxx11_(&local_268,attr);
  poVar1 = std::operator<<(poVar1,(string *)&local_268);
  poVar1 = std::operator<<(poVar1,"=");
  poVar1 = cali::operator<<(poVar1,(Variant *)lock._M_device);
  std::operator<<(poVar1,")\n");
  std::__cxx11::string::~string((string *)&local_268);
  cali::Log::~Log(&local_238);
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return;
}

Assistant:

void set_cb(Caliper* c, ChannelBody*, const Attribute& attr, const Variant& value)
{
    std::lock_guard<std::mutex> lock(dbg_mutex);
    Log(1).stream() << "Event: pre_set (" << attr.name() << "=" << value << ")\n";
}